

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idw.cc
# Opt level: O3

void __thiscall gmath::IDWNode::IDWNode(IDWNode *this,uint _x,uint _y,float _f,float _w)

{
  this->x = _x;
  this->y = _y;
  this->s = 1;
  this->r2 = 25.0;
  this->xs = (float)_x;
  this->ys = (float)_y;
  this->n = 1;
  this->f = _f;
  this->w = _w;
  this->child[0] = (IDWNode *)0x0;
  this->child[1] = (IDWNode *)0x0;
  this->child[2] = (IDWNode *)0x0;
  this->child[3] = (IDWNode *)0x0;
  return;
}

Assistant:

IDWNode::IDWNode(unsigned int _x, unsigned int _y, float _f, float _w)
{
  x=_x;
  y=_y;
  s=1;

  r2=5*5;
  xs=static_cast<float>(x);
  ys=static_cast<float>(y);

  n=1;
  f=_f;
  w=_w;

  child[0]=0;
  child[1]=0;
  child[2]=0;
  child[3]=0;
}